

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_constrain_curvature(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  uint uVar1;
  REF_DBL *metric;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT gradation;
  REF_INT node;
  REF_DBL m_constrained [6];
  REF_DBL m [6];
  REF_DBL *curvature_metric;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x50f,
           "ref_metric_constrain_curvature","malloc curvature_metric of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    metric = (REF_DBL *)malloc((long)(ref_node_00->max * 6) << 3);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x50f,"ref_metric_constrain_curvature","malloc curvature_metric of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      ref_grid_local._4_4_ = ref_metric_from_curvature(metric,ref_grid);
      if (ref_grid_local._4_4_ == 0) {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 0x14;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          uVar1 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x514,"ref_metric_constrain_curvature",(ulong)uVar1,"grad");
            return uVar1;
          }
        }
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_node_00->max;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < ref_node_00->max))
             && (-1 < ref_node_00->global[ref_private_macro_code_rss])) {
            uVar1 = ref_node_metric_get(ref_node_00,ref_private_macro_code_rss,m_constrained + 5);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x518,"ref_metric_constrain_curvature",(ulong)uVar1,"get");
              return uVar1;
            }
            uVar1 = ref_matrix_intersect
                              (metric + ref_private_macro_code_rss * 6,m_constrained + 5,
                               (REF_DBL *)&gradation);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x51a,"ref_metric_constrain_curvature",(ulong)uVar1,"intersect");
              return uVar1;
            }
            if ((ref_grid->twod != 0) &&
               (uVar1 = ref_matrix_twod_m((REF_DBL *)&gradation), uVar1 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x51c,"ref_metric_constrain_curvature",(ulong)uVar1,"enforce twod");
              return uVar1;
            }
            uVar1 = ref_node_metric_set(ref_node_00,ref_private_macro_code_rss,(REF_DBL *)&gradation
                                       );
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x51d,"ref_metric_constrain_curvature",(ulong)uVar1,"set node met");
              return uVar1;
            }
          }
        }
        if (metric != (REF_DBL *)0x0) {
          free(metric);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x510,"ref_metric_constrain_curvature",(ulong)ref_grid_local._4_4_,"curve");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_constrain_curvature(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *curvature_metric;
  REF_DBL m[6], m_constrained[6];
  REF_INT node, gradation;

  ref_malloc(curvature_metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_curvature(curvature_metric, ref_grid), "curve");
  for (gradation = 0; gradation < 20; gradation++) {
    RSS(ref_metric_mixed_space_gradation(curvature_metric, ref_grid, -1.0,
                                         -1.0),
        "grad");
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_matrix_intersect(&(curvature_metric[6 * node]), m, m_constrained),
        "intersect");
    if (ref_grid_twod(ref_grid))
      RSS(ref_matrix_twod_m(m_constrained), "enforce twod");
    RSS(ref_node_metric_set(ref_node, node, m_constrained), "set node met");
  }

  ref_free(curvature_metric);

  return REF_SUCCESS;
}